

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cloud.c
# Opt level: O3

REF_STATUS ref_cloud_push(REF_CLOUD ref_cloud,REF_GLOB global,REF_DBL *aux)

{
  int iVar1;
  int iVar2;
  REF_STATUS RVar3;
  REF_GLOB *__ptr;
  REF_DBL *pRVar4;
  uint uVar5;
  long lVar6;
  
  iVar2 = ref_cloud->n;
  if (ref_cloud->max == iVar2) {
    ref_cloud->max = ref_cloud->max + 100;
    fflush(_stdout);
    __ptr = ref_cloud->global;
    if (0 < (long)ref_cloud->max) {
      __ptr = (REF_GLOB *)realloc(__ptr,(long)ref_cloud->max << 3);
      ref_cloud->global = __ptr;
    }
    if (__ptr == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",0x85,
             "ref_cloud_push","realloc ref_cloud->global NULL");
      uVar5 = ref_cloud->max;
    }
    else {
      fflush(_stdout);
      uVar5 = ref_cloud->max * ref_cloud->naux;
      pRVar4 = ref_cloud->aux;
      if (0 < (int)uVar5) {
        pRVar4 = (REF_DBL *)realloc(pRVar4,(ulong)uVar5 << 3);
        ref_cloud->aux = pRVar4;
      }
      if (pRVar4 != (REF_DBL *)0x0) {
        iVar2 = ref_cloud->n;
        goto LAB_001feb82;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",0x87,
             "ref_cloud_push","realloc ref_cloud->aux NULL");
      uVar5 = ref_cloud->max * ref_cloud->naux;
    }
    printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)uVar5,(long)(int)uVar5,
           8,(long)(int)uVar5 * 8);
    RVar3 = 2;
  }
  else {
LAB_001feb82:
    ref_cloud->n = iVar2 + 1;
    ref_cloud->global[iVar2] = global;
    iVar1 = ref_cloud->naux;
    if ((long)iVar1 < 1) {
      RVar3 = 0;
    }
    else {
      pRVar4 = ref_cloud->aux;
      RVar3 = 0;
      lVar6 = 0;
      do {
        pRVar4[iVar2 * iVar1 + lVar6] = aux[lVar6];
        lVar6 = lVar6 + 1;
      } while (iVar1 != lVar6);
    }
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_cloud_push(REF_CLOUD ref_cloud, REF_GLOB global,
                                  REF_DBL *aux) {
  REF_INT item, i;

  if (ref_cloud_max(ref_cloud) == ref_cloud_n(ref_cloud)) {
    ref_cloud_max(ref_cloud) += 100;

    ref_realloc(ref_cloud->global, ref_cloud_max(ref_cloud), REF_GLOB);
    ref_realloc(ref_cloud->aux,
                ref_cloud_naux(ref_cloud) * ref_cloud_max(ref_cloud), REF_DBL);
  }

  /* fill */
  item = ref_cloud_n(ref_cloud);
  ref_cloud_n(ref_cloud)++;
  ref_cloud_global(ref_cloud, item) = global;
  each_ref_cloud_aux(ref_cloud, i) {
    ref_cloud_aux(ref_cloud, i, item) = aux[i];
  }

  return REF_SUCCESS;
}